

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManTransformToDual(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar14];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001e6ed7;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_001e6ef6:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001e6ef6;
      pGVar3[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  if (0 < p->nObjs) {
    lVar15 = 8;
    lVar14 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar11 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        if (((int)uVar11 < 0) ||
           (uVar13 = *(uint *)((long)pGVar3 +
                              lVar15 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001e6f15;
        iVar5 = Gia_ManHashAnd(p_00,uVar11 ^ (uint)(uVar10 >> 0x1d) & 1,
                               uVar13 ^ (uint)(uVar10 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar5;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar14 = 0;
    do {
      if ((int)uVar10 <= lVar14) goto LAB_001e6f34;
      iVar5 = pVVar9->pArray[lVar14];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001e6ed7;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      uVar13 = (uint)*(undefined8 *)pGVar3;
      uVar11 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar11 < 0) goto LAB_001e6f15;
      Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar11);
      Gia_ManAppendCo(p_00,0);
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCos;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar14 < (long)(uVar10 - (long)p->nRegs));
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar11 = (iVar1 - iVar5) + iVar12;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_001e6f34:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar11];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001e6ed7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001e6f15:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar11;
      iVar12 = iVar12 + 1;
      iVar5 = p->nRegs;
    } while (iVar12 < iVar5);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManTransformToDual( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}